

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Graph<Node>::currCC(Graph<Node> *this,vector<int> *cc,vector<bool> *used,int *node)

{
  undefined8 in_RAX;
  ulong uVar1;
  int iVar2;
  NodeList<Node> *pNVar3;
  NodeList<Node> *pNVar4;
  long lVar5;
  int nxtNode;
  undefined8 uStack_38;
  
  iVar2 = cc->_size;
  uStack_38 = in_RAX;
  if (cc->_capacity <= iVar2) {
    vector<int>::realloc(cc,(void *)(ulong)(uint)(cc->_capacity * 2),(size_t)used);
    iVar2 = cc->_size;
  }
  cc->_size = iVar2 + 1;
  uVar1 = (ulong)*node;
  cc->vect[iVar2] = *node;
  used->vect[uVar1] = true;
  pNVar3 = (this->G).vect;
  if (0 < pNVar3[uVar1].nodes._size) {
    pNVar4 = pNVar3 + uVar1;
    lVar5 = 0;
    do {
      iVar2 = (pNVar4->nodes).vect[lVar5]._index;
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      if (used->vect[iVar2] == false) {
        currCC(this,cc,used,(int *)((long)&uStack_38 + 4));
        pNVar3 = (this->G).vect;
        uVar1 = (ulong)(uint)*node;
      }
      lVar5 = lVar5 + 1;
      pNVar4 = pNVar3 + (int)uVar1;
    } while (lVar5 < (pNVar4->nodes)._size);
  }
  return;
}

Assistant:

void currCC(vector <int> &cc, vector <bool> &used, const int &node) {
        cc.push_back(node);
        used[node] = true;

        for (int nxtInd = 0; nxtInd < G[node].size(); ++nxtInd) {
            int nxtNode = G[node][nxtInd].getIndex();

            if (!used[nxtNode]) {
                currCC(cc, used, nxtNode);
            }
        }
    }